

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O2

void __thiscall
OpenMD::ContactAngle2::ContactAngle2
          (ContactAngle2 *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType solidZ,RealType centroidX,RealType centroidY,RealType threshDens,
          RealType bufferLength,int nrbins,int nzbins)

{
  ostream *poVar1;
  string paramString;
  stringstream params;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer =
       (_func_int **)&PTR__SequentialAnalyzer_002219f0;
  this->solidZ_ = solidZ;
  this->centroidX_ = centroidX;
  this->centroidY_ = centroidY;
  this->threshDens_ = threshDens;
  this->bufferLength_ = bufferLength;
  this->nRBins_ = (long)nrbins;
  this->nZBins_ = (long)nzbins;
  getPrefix(&local_1c8,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 &local_1c8,".ca2");
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::operator<<((ostream *)(local_1a8 + 0x10)," referenceZ = ");
  poVar1 = std::ostream::_M_insert<double>(this->solidZ_);
  std::operator<<(poVar1,", centroid = (");
  poVar1 = std::ostream::_M_insert<double>(this->centroidX_);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(this->centroidY_);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,", threshDens = ");
  poVar1 = std::ostream::_M_insert<double>(this->threshDens_);
  std::operator<<(poVar1,", bufferLength = ");
  poVar1 = std::ostream::_M_insert<double>(this->bufferLength_);
  poVar1 = std::operator<<(poVar1,", nbins = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", nbins_z = ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).paramString_);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return;
}

Assistant:

ContactAngle2::ContactAngle2(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2, RealType solidZ,
                               RealType centroidX, RealType centroidY,
                               RealType threshDens, RealType bufferLength,
                               int nrbins, int nzbins) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      solidZ_(solidZ), centroidX_(centroidX), centroidY_(centroidY),
      threshDens_(threshDens), bufferLength_(bufferLength), nRBins_(nrbins),
      nZBins_(nzbins) {
    setOutputName(getPrefix(filename) + ".ca2");

    std::stringstream params;
    params << " referenceZ = " << solidZ_ << ", centroid = (" << centroidX_
           << ", " << centroidY_ << ")"
           << ", threshDens = " << threshDens_
           << ", bufferLength = " << bufferLength_ << ", nbins = " << nRBins_
           << ", nbins_z = " << nZBins_;

    const std::string paramString = params.str();
    setParameterString(paramString);
  }